

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O2

void Ivy_NodeComputeVolumeTrav2_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  if ((pObj->field_0x8 & 0x10) == 0) {
    return;
  }
  Ivy_NodeComputeVolumeTrav2_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
  Ivy_NodeComputeVolumeTrav2_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Ivy_NodeComputeVolumeTrav2_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( !pObj->fMarkA )
        return;
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin0(pObj), vNodes );
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}